

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  ulong uVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  allocator<char> local_129;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  undefined1 local_110 [24];
  vector<EquationDefinition,_std::allocator<EquationDefinition>_> local_f8;
  vector<LabelDefinition,_std::allocator<LabelDefinition>_> local_e0;
  path local_c8;
  path local_a8;
  path local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  setlocale(0,"");
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < argc) {
    uVar2 = 0;
    do {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_110,argv[uVar2],&local_129)
      ;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_128,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      uVar2 = uVar2 + 1;
    } while ((uint)argc != uVar2);
  }
  ArmipsArguments::ArmipsArguments((ArmipsArguments *)local_110);
  iVar1 = runFromCommandLine(&local_128,(ArmipsArguments *)local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
  }
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
  }
  ghc::filesystem::path::~path(&local_88);
  ghc::filesystem::path::~path(&local_a8);
  ghc::filesystem::path::~path(&local_c8);
  std::vector<LabelDefinition,_std::allocator<LabelDefinition>_>::~vector(&local_e0);
  std::vector<EquationDefinition,_std::allocator<EquationDefinition>_>::~vector(&local_f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_128);
  return iVar1;
}

Assistant:

int main(int argc, char* argv[])
{
	std::setlocale(LC_CTYPE, "");

	std::vector<std::string> arguments;
	for (int i = 0; i < argc; i++)
	{
		arguments.push_back(argv[i]);
	}

	return run(arguments);
}